

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_inter_pred_chroma_horz_ssse3
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined1 (*pauVar1) [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  ulong *in_R8;
  int in_R9D;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int offset_1;
  int offset;
  __m128i res_temp17_8x16b;
  __m128i res_temp16_8x16b;
  __m128i res_temp15_8x16b;
  __m128i res_temp14_8x16b;
  __m128i res_temp13_8x16b;
  __m128i res_temp12_8x16b;
  __m128i res_temp11_8x16b;
  __m128i res_temp7_8x16b;
  __m128i res_temp6_8x16b;
  __m128i res_temp5_8x16b;
  __m128i res_temp4_8x16b;
  __m128i res_temp3_8x16b;
  __m128i res_temp2_8x16b;
  __m128i res_temp1_8x16b;
  __m128i src_temp16_16x8b;
  __m128i src_temp15_16x8b;
  __m128i src_temp14_16x8b;
  __m128i src_temp13_16x8b;
  __m128i src_temp12_16x8b;
  __m128i src_temp11_16x8b;
  __m128i src_temp6_16x8b;
  __m128i src_temp5_16x8b;
  __m128i src_temp4_16x8b;
  __m128i src_temp3_16x8b;
  __m128i src_temp2_16x8b;
  __m128i src_temp1_16x8b;
  __m128i mask_high_96b;
  __m128i mask_low_32b;
  __m128i offset_8x16b;
  __m128i control_mask_2_8x16b;
  __m128i control_mask_1_8x16b;
  __m128i coeff2_3_8x16b;
  __m128i coeff0_1_8x16b;
  WORD32 col;
  WORD32 row;
  int local_860;
  int local_85c;
  undefined1 uStack_816;
  undefined1 uStack_815;
  undefined1 uStack_814;
  undefined1 uStack_813;
  undefined1 uStack_812;
  undefined1 uStack_811;
  undefined1 uStack_80e;
  undefined1 uStack_80d;
  undefined1 uStack_80c;
  undefined1 uStack_80b;
  undefined1 uStack_80a;
  undefined1 uStack_809;
  undefined8 local_7d8;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  int local_644;
  int local_640;
  long local_628;
  long local_620;
  undefined1 local_4a8;
  undefined1 uStack_4a7;
  undefined1 uStack_4a6;
  undefined1 uStack_4a5;
  undefined1 uStack_4a4;
  undefined1 uStack_4a3;
  undefined1 uStack_4a2;
  undefined1 uStack_4a1;
  undefined1 local_498;
  undefined1 uStack_497;
  undefined1 uStack_496;
  undefined1 uStack_495;
  undefined1 uStack_494;
  undefined1 uStack_493;
  undefined1 uStack_492;
  undefined1 uStack_491;
  undefined1 local_488;
  undefined1 uStack_487;
  undefined1 uStack_486;
  undefined1 uStack_485;
  undefined1 uStack_484;
  undefined1 uStack_483;
  undefined1 uStack_482;
  undefined1 uStack_481;
  undefined1 local_478;
  undefined1 uStack_477;
  undefined1 uStack_476;
  undefined1 uStack_475;
  undefined1 uStack_474;
  undefined1 uStack_473;
  undefined1 uStack_472;
  undefined1 uStack_471;
  undefined1 local_468;
  undefined1 uStack_467;
  undefined1 uStack_466;
  undefined1 uStack_465;
  undefined1 uStack_464;
  undefined1 uStack_463;
  undefined1 uStack_462;
  undefined1 uStack_461;
  undefined1 local_458;
  undefined1 uStack_457;
  undefined1 uStack_456;
  undefined1 uStack_455;
  undefined1 uStack_454;
  undefined1 uStack_453;
  undefined1 uStack_452;
  undefined1 uStack_451;
  undefined1 local_448;
  undefined1 uStack_447;
  undefined1 uStack_446;
  undefined1 uStack_445;
  undefined1 uStack_444;
  undefined1 uStack_443;
  undefined1 uStack_442;
  undefined1 uStack_441;
  undefined1 local_438;
  undefined1 uStack_437;
  undefined1 uStack_436;
  undefined1 uStack_435;
  undefined1 uStack_434;
  undefined1 uStack_433;
  undefined1 uStack_432;
  undefined1 uStack_431;
  undefined1 local_428;
  undefined1 uStack_427;
  undefined1 uStack_426;
  undefined1 uStack_425;
  undefined1 local_418;
  undefined1 uStack_417;
  undefined1 uStack_416;
  undefined1 uStack_415;
  undefined1 local_408;
  undefined1 uStack_407;
  undefined1 uStack_406;
  undefined1 uStack_405;
  undefined1 local_3f8;
  undefined1 uStack_3f7;
  undefined1 uStack_3f6;
  undefined1 uStack_3f5;
  undefined1 local_3e8;
  undefined1 uStack_3e7;
  undefined1 uStack_3e6;
  undefined1 uStack_3e5;
  undefined1 local_3d8;
  undefined1 uStack_3d7;
  undefined1 uStack_3d6;
  undefined1 uStack_3d5;
  undefined1 local_3c8;
  undefined1 uStack_3c7;
  undefined1 uStack_3c6;
  undefined1 uStack_3c5;
  undefined1 local_3b8;
  undefined1 uStack_3b7;
  undefined1 uStack_3b6;
  undefined1 uStack_3b5;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short sStack_2e0;
  short sStack_2de;
  short sStack_2dc;
  short sStack_2da;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  short local_2c8;
  short sStack_2c6;
  short sStack_2c4;
  short sStack_2c2;
  short sStack_2c0;
  short sStack_2be;
  short sStack_2bc;
  short sStack_2ba;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  
  if (offset_1 % 2 != 0) {
    __assert_fail("(wd % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0xe35,
                  "void ihevc_inter_pred_chroma_horz_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *in_R8;
  auVar16._8_8_ = 0x100010001000100;
  auVar16._0_8_ = 0x100010001000100;
  auVar16 = pshufb(auVar19,auVar16);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *in_R8;
  auVar17._8_8_ = 0x302030203020302;
  auVar17._0_8_ = 0x302030203020302;
  auVar17 = pshufb(auVar18,auVar17);
  local_628 = in_RSI;
  local_620 = in_RDI;
  if ((offset_1 % 2 == 0) && (offset_1 % 4 != 0)) {
    for (local_640 = 0; local_640 < in_R9D; local_640 = local_640 + 2) {
      local_85c = 0;
      for (local_644 = 0; SBORROW4(local_644,offset_1 * 2) != local_644 + offset_1 * -2 < 0;
          local_644 = local_644 + 4) {
        pauVar1 = (undefined1 (*) [16])(local_620 + -2 + (long)local_85c);
        uVar2 = *(undefined8 *)*pauVar1;
        auVar4 = *pauVar1;
        auVar19 = *pauVar1;
        auVar18 = *pauVar1;
        pauVar1 = (undefined1 (*) [16])((long)local_85c + -2 + local_620 + in_EDX);
        uVar3 = *(undefined8 *)*pauVar1;
        auVar7 = *pauVar1;
        auVar6 = *pauVar1;
        auVar5 = *pauVar1;
        local_3b8 = (undefined1)uVar2;
        uStack_3b7 = (undefined1)((ulong)uVar2 >> 8);
        uStack_3b6 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_3b5 = (undefined1)((ulong)uVar2 >> 0x18);
        local_3c8 = auVar18[2];
        uStack_3c7 = auVar18[3];
        uStack_3c6 = auVar18[4];
        uStack_3c5 = auVar18[5];
        local_3d8 = auVar19[4];
        uStack_3d7 = auVar19[5];
        uStack_3d6 = auVar19[6];
        uStack_3d5 = auVar19[7];
        local_3e8 = auVar4[6];
        uStack_3e7 = auVar4[7];
        uStack_3e6 = auVar4[8];
        uStack_3e5 = auVar4[9];
        local_3f8 = (undefined1)uVar3;
        uStack_3f7 = (undefined1)((ulong)uVar3 >> 8);
        uStack_3f6 = (undefined1)((ulong)uVar3 >> 0x10);
        uStack_3f5 = (undefined1)((ulong)uVar3 >> 0x18);
        local_408 = auVar5[2];
        uStack_407 = auVar5[3];
        uStack_406 = auVar5[4];
        uStack_405 = auVar5[5];
        local_418 = auVar6[4];
        uStack_417 = auVar6[5];
        uStack_416 = auVar6[6];
        uStack_415 = auVar6[7];
        local_428 = auVar7[6];
        uStack_427 = auVar7[7];
        uStack_426 = auVar7[8];
        uStack_425 = auVar7[9];
        auVar9[1] = local_3c8;
        auVar9[0] = local_3b8;
        auVar9[2] = uStack_3b7;
        auVar9[3] = uStack_3c7;
        auVar9[4] = uStack_3b6;
        auVar9[5] = uStack_3c6;
        auVar9[6] = uStack_3b5;
        auVar9[7] = uStack_3c5;
        auVar9[9] = local_408;
        auVar9[8] = local_3f8;
        auVar9[10] = uStack_3f7;
        auVar9[0xb] = uStack_407;
        auVar9[0xc] = uStack_3f6;
        auVar9[0xd] = uStack_406;
        auVar9[0xe] = uStack_3f5;
        auVar9[0xf] = uStack_405;
        auVar8[1] = local_3e8;
        auVar8[0] = local_3d8;
        auVar8[2] = uStack_3d7;
        auVar8[3] = uStack_3e7;
        auVar8[4] = uStack_3d6;
        auVar8[5] = uStack_3e6;
        auVar8[6] = uStack_3d5;
        auVar8[7] = uStack_3e5;
        auVar8[9] = local_428;
        auVar8[8] = local_418;
        auVar8[10] = uStack_417;
        auVar8[0xb] = uStack_427;
        auVar8[0xc] = uStack_416;
        auVar8[0xd] = uStack_426;
        auVar8[0xe] = uStack_415;
        auVar8[0xf] = uStack_425;
        auVar18 = pmaddubsw(auVar9,auVar16);
        auVar19 = pmaddubsw(auVar8,auVar17);
        local_298 = auVar18._0_2_;
        sStack_296 = auVar18._2_2_;
        sStack_294 = auVar18._4_2_;
        sStack_292 = auVar18._6_2_;
        sStack_290 = auVar18._8_2_;
        sStack_28e = auVar18._10_2_;
        sStack_28c = auVar18._12_2_;
        sStack_28a = auVar18._14_2_;
        local_2a8 = auVar19._0_2_;
        sStack_2a6 = auVar19._2_2_;
        sStack_2a4 = auVar19._4_2_;
        sStack_2a2 = auVar19._6_2_;
        sStack_2a0 = auVar19._8_2_;
        sStack_29e = auVar19._10_2_;
        sStack_29c = auVar19._12_2_;
        sStack_29a = auVar19._14_2_;
        uStack_816 = (undefined1)(sStack_296 + sStack_2a6);
        uStack_815 = (undefined1)((ushort)(sStack_296 + sStack_2a6) >> 8);
        uStack_814 = (undefined1)(sStack_294 + sStack_2a4);
        uStack_813 = (undefined1)((ushort)(sStack_294 + sStack_2a4) >> 8);
        uStack_812 = (undefined1)(sStack_292 + sStack_2a2);
        uStack_811 = (undefined1)((ushort)(sStack_292 + sStack_2a2) >> 8);
        uStack_80e = (undefined1)(sStack_28e + sStack_29e);
        uStack_80d = (undefined1)((ushort)(sStack_28e + sStack_29e) >> 8);
        uStack_80c = (undefined1)(sStack_28c + sStack_29c);
        uStack_80b = (undefined1)((ushort)(sStack_28c + sStack_29c) >> 8);
        uStack_80a = (undefined1)(sStack_28a + sStack_29a);
        uStack_809 = (undefined1)((ushort)(sStack_28a + sStack_29a) >> 8);
        auVar15[2] = uStack_816;
        auVar15._0_2_ = local_298 + local_2a8;
        auVar15[3] = uStack_815;
        auVar15[4] = uStack_814;
        auVar15[5] = uStack_813;
        auVar15[6] = uStack_812;
        auVar15[7] = uStack_811;
        auVar15[10] = uStack_80e;
        auVar15._8_2_ = sStack_290 + sStack_2a0;
        auVar15[0xb] = uStack_80d;
        auVar15[0xc] = uStack_80c;
        auVar15[0xd] = uStack_80b;
        auVar15[0xe] = uStack_80a;
        auVar15[0xf] = uStack_809;
        auVar14._8_8_ = 0x20002000200020;
        auVar14._0_8_ = 0x20002000200020;
        auVar18 = paddsw(auVar15,auVar14);
        psraw(auVar18,ZEXT416(6));
        *(ulong *)(local_628 + local_85c) = *(ulong *)(local_628 + local_85c) & 0xffffffff00000000;
        *(ulong *)(local_628 + in_ECX + (long)local_85c) =
             *(ulong *)(local_628 + in_ECX + (long)local_85c) & 0xffffffff00000000;
        local_85c = local_85c + 4;
      }
      local_620 = local_620 + (in_EDX << 1);
      local_628 = local_628 + (in_ECX << 1);
    }
  }
  else {
    for (local_640 = 0; local_640 < in_R9D; local_640 = local_640 + 2) {
      local_860 = 0;
      for (local_644 = 0; SBORROW4(local_644,offset_1 * 2) != local_644 + offset_1 * -2 < 0;
          local_644 = local_644 + 8) {
        pauVar1 = (undefined1 (*) [16])(local_620 + -2 + (long)local_860);
        uVar2 = *(undefined8 *)*pauVar1;
        auVar4 = *pauVar1;
        auVar19 = *pauVar1;
        auVar18 = *pauVar1;
        pauVar1 = (undefined1 (*) [16])((long)local_860 + -2 + local_620 + in_EDX);
        uVar3 = *(undefined8 *)*pauVar1;
        auVar11 = *pauVar1;
        auVar10 = *pauVar1;
        auVar5 = *pauVar1;
        local_438 = (undefined1)uVar2;
        uStack_437 = (undefined1)((ulong)uVar2 >> 8);
        uStack_436 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_435 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_434 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_433 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_432 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_431 = (undefined1)((ulong)uVar2 >> 0x38);
        local_448 = auVar18[2];
        uStack_447 = auVar18[3];
        uStack_446 = auVar18[4];
        uStack_445 = auVar18[5];
        uStack_444 = auVar18[6];
        uStack_443 = auVar18[7];
        uStack_442 = auVar18[8];
        uStack_441 = auVar18[9];
        local_458 = auVar19[4];
        uStack_457 = auVar19[5];
        uStack_456 = auVar19[6];
        uStack_455 = auVar19[7];
        uStack_454 = auVar19[8];
        uStack_453 = auVar19[9];
        uStack_452 = auVar19[10];
        uStack_451 = auVar19[0xb];
        local_468 = auVar4[6];
        uStack_467 = auVar4[7];
        uStack_466 = auVar4[8];
        uStack_465 = auVar4[9];
        uStack_464 = auVar4[10];
        uStack_463 = auVar4[0xb];
        uStack_462 = auVar4[0xc];
        uStack_461 = auVar4[0xd];
        auVar7[1] = local_448;
        auVar7[0] = local_438;
        auVar7[2] = uStack_437;
        auVar7[3] = uStack_447;
        auVar7[4] = uStack_436;
        auVar7[5] = uStack_446;
        auVar7[6] = uStack_435;
        auVar7[7] = uStack_445;
        auVar7[9] = uStack_444;
        auVar7[8] = uStack_434;
        auVar7[10] = uStack_433;
        auVar7[0xb] = uStack_443;
        auVar7[0xc] = uStack_432;
        auVar7[0xd] = uStack_442;
        auVar7[0xe] = uStack_431;
        auVar7[0xf] = uStack_441;
        auVar18 = pmaddubsw(auVar7,auVar16);
        auVar6[1] = local_468;
        auVar6[0] = local_458;
        auVar6[2] = uStack_457;
        auVar6[3] = uStack_467;
        auVar6[4] = uStack_456;
        auVar6[5] = uStack_466;
        auVar6[6] = uStack_455;
        auVar6[7] = uStack_465;
        auVar6[9] = uStack_464;
        auVar6[8] = uStack_454;
        auVar6[10] = uStack_453;
        auVar6[0xb] = uStack_463;
        auVar6[0xc] = uStack_452;
        auVar6[0xd] = uStack_462;
        auVar6[0xe] = uStack_451;
        auVar6[0xf] = uStack_461;
        auVar19 = pmaddubsw(auVar6,auVar17);
        local_2b8 = auVar18._0_2_;
        sStack_2b6 = auVar18._2_2_;
        sStack_2b4 = auVar18._4_2_;
        sStack_2b2 = auVar18._6_2_;
        sStack_2b0 = auVar18._8_2_;
        sStack_2ae = auVar18._10_2_;
        sStack_2ac = auVar18._12_2_;
        sStack_2aa = auVar18._14_2_;
        local_2c8 = auVar19._0_2_;
        sStack_2c6 = auVar19._2_2_;
        sStack_2c4 = auVar19._4_2_;
        sStack_2c2 = auVar19._6_2_;
        sStack_2c0 = auVar19._8_2_;
        sStack_2be = auVar19._10_2_;
        sStack_2bc = auVar19._12_2_;
        sStack_2ba = auVar19._14_2_;
        local_7a8._0_4_ = CONCAT22(sStack_2b6 + sStack_2c6,local_2b8 + local_2c8);
        local_7a8._0_6_ = CONCAT24(sStack_2b4 + sStack_2c4,(undefined4)local_7a8);
        local_7a8 = CONCAT26(sStack_2b2 + sStack_2c2,(undefined6)local_7a8);
        uStack_7a0._0_2_ = sStack_2b0 + sStack_2c0;
        uStack_7a0._2_2_ = sStack_2ae + sStack_2be;
        uStack_7a0._4_2_ = sStack_2ac + sStack_2bc;
        uStack_7a0._6_2_ = sStack_2aa + sStack_2ba;
        auVar13._8_8_ = uStack_7a0;
        auVar13._0_8_ = local_7a8;
        auVar12._8_8_ = 0x20002000200020;
        auVar12._0_8_ = 0x20002000200020;
        auVar18 = paddsw(auVar13,auVar12);
        auVar18 = psraw(auVar18,ZEXT416(6));
        local_198 = auVar18._0_2_;
        sStack_196 = auVar18._2_2_;
        sStack_194 = auVar18._4_2_;
        sStack_192 = auVar18._6_2_;
        sStack_190 = auVar18._8_2_;
        sStack_18e = auVar18._10_2_;
        sStack_18c = auVar18._12_2_;
        sStack_18a = auVar18._14_2_;
        local_7d8 = CONCAT17((0 < sStack_18a) * (sStack_18a < 0x100) * auVar18[0xe] -
                             (0xff < sStack_18a),
                             CONCAT16((0 < sStack_18c) * (sStack_18c < 0x100) * auVar18[0xc] -
                                      (0xff < sStack_18c),
                                      CONCAT15((0 < sStack_18e) * (sStack_18e < 0x100) * auVar18[10]
                                               - (0xff < sStack_18e),
                                               CONCAT14((0 < sStack_190) * (sStack_190 < 0x100) *
                                                        auVar18[8] - (0xff < sStack_190),
                                                        CONCAT13((0 < sStack_192) *
                                                                 (sStack_192 < 0x100) * auVar18[6] -
                                                                 (0xff < sStack_192),
                                                                 CONCAT12((0 < sStack_194) *
                                                                          (sStack_194 < 0x100) *
                                                                          auVar18[4] -
                                                                          (0xff < sStack_194),
                                                                          CONCAT11((0 < sStack_196)
                                                                                   * (sStack_196 <
                                                                                     0x100) *
                                                                                   auVar18[2] -
                                                                                   (0xff < 
                                                  sStack_196),
                                                  (0 < local_198) * (local_198 < 0x100) * auVar18[0]
                                                  - (0xff < local_198))))))));
        *(undefined8 *)(local_628 + local_860) = local_7d8;
        local_478 = (undefined1)uVar3;
        uStack_477 = (undefined1)((ulong)uVar3 >> 8);
        uStack_476 = (undefined1)((ulong)uVar3 >> 0x10);
        uStack_475 = (undefined1)((ulong)uVar3 >> 0x18);
        uStack_474 = (undefined1)((ulong)uVar3 >> 0x20);
        uStack_473 = (undefined1)((ulong)uVar3 >> 0x28);
        uStack_472 = (undefined1)((ulong)uVar3 >> 0x30);
        uStack_471 = (undefined1)((ulong)uVar3 >> 0x38);
        local_488 = auVar5[2];
        uStack_487 = auVar5[3];
        uStack_486 = auVar5[4];
        uStack_485 = auVar5[5];
        uStack_484 = auVar5[6];
        uStack_483 = auVar5[7];
        uStack_482 = auVar5[8];
        uStack_481 = auVar5[9];
        local_498 = auVar10[4];
        uStack_497 = auVar10[5];
        uStack_496 = auVar10[6];
        uStack_495 = auVar10[7];
        uStack_494 = auVar10[8];
        uStack_493 = auVar10[9];
        uStack_492 = auVar10[10];
        uStack_491 = auVar10[0xb];
        local_4a8 = auVar11[6];
        uStack_4a7 = auVar11[7];
        uStack_4a6 = auVar11[8];
        uStack_4a5 = auVar11[9];
        uStack_4a4 = auVar11[10];
        uStack_4a3 = auVar11[0xb];
        uStack_4a2 = auVar11[0xc];
        uStack_4a1 = auVar11[0xd];
        auVar5[1] = local_488;
        auVar5[0] = local_478;
        auVar5[2] = uStack_477;
        auVar5[3] = uStack_487;
        auVar5[4] = uStack_476;
        auVar5[5] = uStack_486;
        auVar5[6] = uStack_475;
        auVar5[7] = uStack_485;
        auVar5[9] = uStack_484;
        auVar5[8] = uStack_474;
        auVar5[10] = uStack_473;
        auVar5[0xb] = uStack_483;
        auVar5[0xc] = uStack_472;
        auVar5[0xd] = uStack_482;
        auVar5[0xe] = uStack_471;
        auVar5[0xf] = uStack_481;
        auVar18 = pmaddubsw(auVar5,auVar16);
        auVar4[1] = local_4a8;
        auVar4[0] = local_498;
        auVar4[2] = uStack_497;
        auVar4[3] = uStack_4a7;
        auVar4[4] = uStack_496;
        auVar4[5] = uStack_4a6;
        auVar4[6] = uStack_495;
        auVar4[7] = uStack_4a5;
        auVar4[9] = uStack_4a4;
        auVar4[8] = uStack_494;
        auVar4[10] = uStack_493;
        auVar4[0xb] = uStack_4a3;
        auVar4[0xc] = uStack_492;
        auVar4[0xd] = uStack_4a2;
        auVar4[0xe] = uStack_491;
        auVar4[0xf] = uStack_4a1;
        auVar19 = pmaddubsw(auVar4,auVar17);
        local_2d8 = auVar18._0_2_;
        sStack_2d6 = auVar18._2_2_;
        sStack_2d4 = auVar18._4_2_;
        sStack_2d2 = auVar18._6_2_;
        sStack_2d0 = auVar18._8_2_;
        sStack_2ce = auVar18._10_2_;
        sStack_2cc = auVar18._12_2_;
        sStack_2ca = auVar18._14_2_;
        local_2e8 = auVar19._0_2_;
        sStack_2e6 = auVar19._2_2_;
        sStack_2e4 = auVar19._4_2_;
        sStack_2e2 = auVar19._6_2_;
        sStack_2e0 = auVar19._8_2_;
        sStack_2de = auVar19._10_2_;
        sStack_2dc = auVar19._12_2_;
        sStack_2da = auVar19._14_2_;
        uStack_816 = (undefined1)(sStack_2d6 + sStack_2e6);
        uStack_815 = (undefined1)((ushort)(sStack_2d6 + sStack_2e6) >> 8);
        uStack_814 = (undefined1)(sStack_2d4 + sStack_2e4);
        uStack_813 = (undefined1)((ushort)(sStack_2d4 + sStack_2e4) >> 8);
        uStack_812 = (undefined1)(sStack_2d2 + sStack_2e2);
        uStack_811 = (undefined1)((ushort)(sStack_2d2 + sStack_2e2) >> 8);
        uStack_80e = (undefined1)(sStack_2ce + sStack_2de);
        uStack_80d = (undefined1)((ushort)(sStack_2ce + sStack_2de) >> 8);
        uStack_80c = (undefined1)(sStack_2cc + sStack_2dc);
        uStack_80b = (undefined1)((ushort)(sStack_2cc + sStack_2dc) >> 8);
        uStack_80a = (undefined1)(sStack_2ca + sStack_2da);
        uStack_809 = (undefined1)((ushort)(sStack_2ca + sStack_2da) >> 8);
        auVar11[2] = uStack_816;
        auVar11._0_2_ = local_2d8 + local_2e8;
        auVar11[3] = uStack_815;
        auVar11[4] = uStack_814;
        auVar11[5] = uStack_813;
        auVar11[6] = uStack_812;
        auVar11[7] = uStack_811;
        auVar11[10] = uStack_80e;
        auVar11._8_2_ = sStack_2d0 + sStack_2e0;
        auVar11[0xb] = uStack_80d;
        auVar11[0xc] = uStack_80c;
        auVar11[0xd] = uStack_80b;
        auVar11[0xe] = uStack_80a;
        auVar11[0xf] = uStack_809;
        auVar10._8_8_ = 0x20002000200020;
        auVar10._0_8_ = 0x20002000200020;
        auVar18 = paddsw(auVar11,auVar10);
        auVar18 = psraw(auVar18,ZEXT416(6));
        local_1b8 = auVar18._0_2_;
        sStack_1b6 = auVar18._2_2_;
        sStack_1b4 = auVar18._4_2_;
        sStack_1b2 = auVar18._6_2_;
        sStack_1b0 = auVar18._8_2_;
        sStack_1ae = auVar18._10_2_;
        sStack_1ac = auVar18._12_2_;
        sStack_1aa = auVar18._14_2_;
        *(ulong *)(local_628 + in_ECX + (long)local_860) =
             CONCAT17((0 < sStack_1aa) * (sStack_1aa < 0x100) * auVar18[0xe] - (0xff < sStack_1aa),
                      CONCAT16((0 < sStack_1ac) * (sStack_1ac < 0x100) * auVar18[0xc] -
                               (0xff < sStack_1ac),
                               CONCAT15((0 < sStack_1ae) * (sStack_1ae < 0x100) * auVar18[10] -
                                        (0xff < sStack_1ae),
                                        CONCAT14((0 < sStack_1b0) * (sStack_1b0 < 0x100) *
                                                 auVar18[8] - (0xff < sStack_1b0),
                                                 CONCAT13((0 < sStack_1b2) * (sStack_1b2 < 0x100) *
                                                          auVar18[6] - (0xff < sStack_1b2),
                                                          CONCAT12((0 < sStack_1b4) *
                                                                   (sStack_1b4 < 0x100) * auVar18[4]
                                                                   - (0xff < sStack_1b4),
                                                                   CONCAT11((0 < sStack_1b6) *
                                                                            (sStack_1b6 < 0x100) *
                                                                            auVar18[2] -
                                                                            (0xff < sStack_1b6),
                                                                            (0 < local_1b8) *
                                                                            (local_1b8 < 0x100) *
                                                                            auVar18[0] -
                                                                            (0xff < local_1b8)))))))
                     );
        local_860 = local_860 + 8;
      }
      local_620 = local_620 + (in_EDX << 1);
      local_628 = local_628 + (in_ECX << 1);
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_horz_ssse3(UWORD8 *pu1_src,
                                        UWORD8 *pu1_dst,
                                        WORD32 src_strd,
                                        WORD32 dst_strd,
                                        WORD8 *pi1_coeff,
                                        WORD32 ht,
                                        WORD32 wd)
{
    WORD32 row, col;

    __m128i coeff0_1_8x16b, coeff2_3_8x16b, control_mask_1_8x16b, control_mask_2_8x16b, offset_8x16b, mask_low_32b, mask_high_96b;
    __m128i src_temp1_16x8b, src_temp2_16x8b, src_temp3_16x8b, src_temp4_16x8b, src_temp5_16x8b, src_temp6_16x8b;
    __m128i src_temp11_16x8b, src_temp12_16x8b, src_temp13_16x8b, src_temp14_16x8b, src_temp15_16x8b, src_temp16_16x8b;
    __m128i res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b, res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;
    __m128i res_temp11_8x16b, res_temp12_8x16b, res_temp13_8x16b, res_temp14_8x16b, res_temp15_8x16b, res_temp16_8x16b, res_temp17_8x16b;

    PREFETCH((char const *)(pu1_src + (0 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (1 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (2 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (3 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)

    ASSERT(wd % 2 == 0); /* checking assumption*/

/* loading four 8-bit coefficients  */
    src_temp1_16x8b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    offset_8x16b = _mm_set1_epi16(OFFSET_14_MINUS_BIT_DEPTH); /* for offset addition */
    mask_low_32b = _mm_cmpeq_epi16(offset_8x16b, offset_8x16b);
    mask_high_96b = _mm_srli_si128(mask_low_32b, 12);
    mask_low_32b = _mm_slli_si128(mask_low_32b, 4);

    control_mask_1_8x16b = _mm_set1_epi32(0x01000100); /* Control Mask register */
    control_mask_2_8x16b = _mm_set1_epi32(0x03020302); /* Control Mask register */

    coeff0_1_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_1_8x16b);  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_2_8x16b);  /* pi1_coeff[4] */

/*  outer for loop starts from here */
    if(wd % 2 == 0 && wd % 4 != 0)
    {

        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;

            PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


            for(col = 0; col < 2 * wd; col += 4)
            {


                /*load 16 pixel values from row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*load 16 pixel values from row 1*/
                src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + src_strd + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                /*Derive the source pixels for processing the 2nd pixel*/
                src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);

                src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b);

                /*Derive the source pixels for processing the 3rd pixel*/
                src_temp13_16x8b = _mm_srli_si128(src_temp11_16x8b, 4);
                /*Derive the source pixels for processing the 4th pixel*/
                src_temp14_16x8b = _mm_srli_si128(src_temp11_16x8b, 6);

                src_temp16_16x8b = _mm_unpacklo_epi8(src_temp13_16x8b, src_temp14_16x8b);

                res_temp1_8x16b = _mm_unpacklo_epi64(src_temp5_16x8b, src_temp15_16x8b);
                res_temp2_8x16b = _mm_unpacklo_epi64(src_temp6_16x8b, src_temp16_16x8b);
                res_temp11_8x16b = _mm_maddubs_epi16(res_temp1_8x16b, coeff0_1_8x16b);
                res_temp12_8x16b = _mm_maddubs_epi16(res_temp2_8x16b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp13_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);

                res_temp14_8x16b = _mm_adds_epi16(res_temp13_8x16b, offset_8x16b);             /* row = 0 */
                res_temp15_8x16b = _mm_srai_epi16(res_temp14_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                res_temp13_8x16b = _mm_packus_epi16(res_temp15_8x16b, res_temp15_8x16b);       /* row = 0 */

                res_temp3_8x16b = _mm_srli_si128(res_temp13_8x16b, 4);

                res_temp4_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + offset));
                res_temp5_8x16b =  _mm_and_si128(res_temp4_8x16b, mask_low_32b);
                res_temp6_8x16b =  _mm_and_si128(res_temp13_8x16b, mask_high_96b);
                res_temp7_8x16b = _mm_or_si128(res_temp5_8x16b, res_temp6_8x16b);

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp7_8x16b); /* pu1_dst[col] = i2_tmp_u  */

                res_temp14_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd + offset));
                res_temp15_8x16b =  _mm_and_si128(res_temp14_8x16b, mask_low_32b);
                res_temp16_8x16b =  _mm_and_si128(res_temp3_8x16b, mask_high_96b);
                res_temp17_8x16b = _mm_or_si128(res_temp15_8x16b, res_temp16_8x16b);

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp17_8x16b); /* pu1_dst[col] = i2_tmp_u  */


                offset += 4; /* To pointer update*/

            } /* inner loop ends here(8- output values in single iteration)*/

            pu1_src += 2 * src_strd; /*pointer update*/
            pu1_dst += 2 * dst_strd; /*pointer update*/
        }
    }
    else
    {

        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;

            PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


            for(col = 0; col < 2 * wd; col += 8)
            {

                /*load 16 pixel values from row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*load 16 pixel values from row 1*/
                src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + src_strd + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                res_temp1_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff0_1_8x16b);
                res_temp2_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp3_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);

                res_temp4_8x16b = _mm_adds_epi16(res_temp3_8x16b, offset_8x16b);             /* row = 0 */
                res_temp5_8x16b = _mm_srai_epi16(res_temp4_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                res_temp6_8x16b = _mm_packus_epi16(res_temp5_8x16b, res_temp5_8x16b);        /* row = 0 */

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp6_8x16b); /* pi2_dst[col] = i2_tmp_u  */

                /*Derive the source pixels for processing the 2nd pixel of row 1*/
                src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);

                src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 1*/
                src_temp13_16x8b = _mm_srli_si128(src_temp11_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 1*/
                src_temp14_16x8b = _mm_srli_si128(src_temp11_16x8b, 6);

                src_temp16_16x8b = _mm_unpacklo_epi8(src_temp13_16x8b, src_temp14_16x8b);

                res_temp11_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff0_1_8x16b);
                res_temp12_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp13_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);

                res_temp14_8x16b = _mm_adds_epi16(res_temp13_8x16b, offset_8x16b);             /* row = 0 */
                res_temp15_8x16b = _mm_srai_epi16(res_temp14_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                res_temp16_8x16b = _mm_packus_epi16(res_temp15_8x16b, res_temp15_8x16b);       /* row = 0 */

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp16_8x16b); /* pu1_dst[col] = i2_tmp_u  */


                offset += 8; /* To pointer update*/

            } /* inner loop ends here(8- output values in single iteration)*/

            pu1_src += 2 * src_strd; /*pointer update*/
            pu1_dst += 2 * dst_strd; /*pointer update*/
        }
    }
}